

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O2

double Distance::getRobinsonFouldsDistance
                 (string *t1,string *t2,bool normalise,bool rooted1,bool rooted2)

{
  double dVar1;
  PhyloTree b;
  PhyloTree a;
  string local_138;
  string local_118;
  PhyloTree local_f8;
  PhyloTree local_90;
  
  std::__cxx11::string::string((string *)&local_118,(string *)t1);
  PhyloTree::PhyloTree(&local_90,&local_118,rooted1);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,(string *)t2);
  PhyloTree::PhyloTree(&local_f8,&local_138,rooted2);
  std::__cxx11::string::~string((string *)&local_138);
  dVar1 = getRobinsonFouldsDistance(&local_90,&local_f8,normalise);
  PhyloTree::~PhyloTree(&local_f8);
  PhyloTree::~PhyloTree(&local_90);
  return dVar1;
}

Assistant:

double Distance::getRobinsonFouldsDistance(const string& t1, const string& t2, bool normalise, bool rooted1, bool rooted2) {
    PhyloTree a(t1, rooted1);
    PhyloTree b(t2, rooted2);
    return getRobinsonFouldsDistance(a, b, normalise);
}